

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int32_t zng_inflateInit2(zng_stream *strm,int32_t windowBits)

{
  inflate_state *piVar1;
  uint32_t uVar2;
  int32_t iVar3;
  inflate_allocs *piVar4;
  
  (*functable.force_init)();
  if (strm == (zng_stream *)0x0) {
    iVar3 = -2;
  }
  else {
    strm->msg = (char *)0x0;
    if (strm->zalloc == (alloc_func)0x0) {
      strm->zalloc = zng_zcalloc;
      strm->opaque = (void *)0x0;
    }
    if (strm->zfree == (free_func)0x0) {
      strm->zfree = zng_zcfree;
    }
    piVar4 = alloc_inflate(strm);
    if (piVar4 == (inflate_allocs *)0x0) {
      iVar3 = -4;
    }
    else {
      piVar1 = piVar4->state;
      piVar1->window = piVar4->window;
      piVar1->alloc_bufs = piVar4;
      piVar1->wbufsize = 0x8040;
      strm->state = (internal_state *)piVar1;
      piVar1->strm = strm;
      piVar1->mode = HEAD;
      uVar2 = (*functable.chunksize)();
      piVar1->chunksize = uVar2;
      iVar3 = zng_inflateReset2(strm,windowBits);
      if (iVar3 == 0) {
        iVar3 = 0;
      }
      else {
        free_inflate(strm);
      }
    }
  }
  return iVar3;
}

Assistant:

PREFIX(inflateInit2)(PREFIX3(stream) *strm, int32_t windowBits) {
    struct inflate_state *state;
    int32_t ret;

    /* Initialize functable */
    FUNCTABLE_INIT;

    if (strm == NULL)
        return Z_STREAM_ERROR;
    strm->msg = NULL;                   /* in case we return an error */
    if (strm->zalloc == NULL) {
        strm->zalloc = PREFIX(zcalloc);
        strm->opaque = NULL;
    }
    if (strm->zfree == NULL)
        strm->zfree = PREFIX(zcfree);

    inflate_allocs *alloc_bufs = alloc_inflate(strm);
    if (alloc_bufs == NULL)
        return Z_MEM_ERROR;

    state = alloc_bufs->state;
    state->window = alloc_bufs->window;
    state->alloc_bufs = alloc_bufs;
    state->wbufsize = INFLATE_ADJUST_WINDOW_SIZE((1 << MAX_WBITS) + 64);
    Tracev((stderr, "inflate: allocated\n"));

    strm->state = (struct internal_state *)state;
    state->strm = strm;
    state->mode = HEAD;     /* to pass state test in inflateReset2() */
    state->chunksize = FUNCTABLE_CALL(chunksize)();
    ret = PREFIX(inflateReset2)(strm, windowBits);
    if (ret != Z_OK) {
        free_inflate(strm);
    }
    return ret;
}